

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O3

void __thiscall slang::ast::builtins::FGetsFunc::FGetsFunc(FGetsFunc *this)

{
  string_view sVar1;
  
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005dafe8;
  sVar1 = parsing::toString(FGets);
  (this->super_SystemSubroutine).name._M_dataplus._M_p =
       (pointer)&(this->super_SystemSubroutine).name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_SystemSubroutine).name,sVar1._M_str,sVar1._M_str + sVar1._M_len
            );
  (this->super_SystemSubroutine).kind = Function;
  (this->super_SystemSubroutine).knownNameId = FGets;
  (this->super_SystemSubroutine).withClauseMode = None;
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005d8530;
  (this->super_SystemSubroutine).hasOutputArgs = true;
  (this->super_SystemSubroutine).neverReturns = false;
  return;
}

Assistant:

FGetsFunc() : SystemSubroutine(KnownSystemName::FGets, SubroutineKind::Function) {
        hasOutputArgs = true;
    }